

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void unreversed_copy(int N,v4sf *in,v4sf *out,int out_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  v4sf tmp___1;
  v4sf tmp__;
  int local_6c;
  int k;
  v4sf h1;
  v4sf h0;
  v4sf g1;
  v4sf g0;
  v4sf *pafStack_20;
  int out_stride_local;
  v4sf *out_local;
  v4sf *in_local;
  int N_local;
  
  uVar1 = *(undefined8 *)*in;
  g1._0_8_ = *(undefined8 *)(*in + 2);
  pafStack_20 = out;
  out_local = in + 1;
  for (local_6c = 1; local_6c < N; local_6c = local_6c + 1) {
    uVar2 = *(undefined8 *)*out_local;
    uVar3 = *(undefined8 *)(*out_local + 2);
    uVar4 = *(undefined8 *)out_local[1];
    uVar5 = *(undefined8 *)(out_local[1] + 2);
    h1[3] = (float)((ulong)uVar2 >> 0x20);
    k = (int)((ulong)uVar4 >> 0x20);
    h0[1] = (float)((ulong)uVar3 >> 0x20);
    pafStack_20[1][0] = (float)k;
    pafStack_20[1][1] = h0[1];
    pafStack_20[1][2] = h1[3];
    pafStack_20[1][3] = g1[1];
    *(ulong *)*pafStack_20 = CONCAT44((int)uVar3,(int)uVar4);
    *(ulong *)(*pafStack_20 + 2) = CONCAT44((float)g1._0_8_,(int)uVar2);
    pafStack_20 = pafStack_20 + out_stride;
    g1._0_8_ = uVar5;
    out_local = out_local + 2;
  }
  uVar2 = *(undefined8 *)*out_local;
  uVar3 = *(undefined8 *)(*out_local + 2);
  h1[3] = (float)((ulong)uVar2 >> 0x20);
  k = (int)((ulong)uVar1 >> 0x20);
  h0[1] = (float)((ulong)uVar3 >> 0x20);
  pafStack_20[1][0] = (float)k;
  pafStack_20[1][1] = h0[1];
  pafStack_20[1][2] = h1[3];
  pafStack_20[1][3] = g1[1];
  *(ulong *)*pafStack_20 = CONCAT44((int)uVar3,(int)uVar1);
  *(ulong *)(*pafStack_20 + 2) = CONCAT44((float)g1._0_8_,(int)uVar2);
  return;
}

Assistant:

static void unreversed_copy(int N, const v4sf *in, v4sf *out, int out_stride) {
  v4sf g0, g1, h0, h1;
  int k;
  g0 = g1 = in[0]; ++in;
  for (k=1; k < N; ++k) {
    h0 = *in++; h1 = *in++;
    g1 = VSWAPHL(g1, h0);
    h0 = VSWAPHL(h0, h1);
    UNINTERLEAVE2(h0, g1, out[0], out[1]); out += out_stride;
    g1 = h1;
  }
  h0 = *in++; h1 = g0;
  g1 = VSWAPHL(g1, h0);
  h0 = VSWAPHL(h0, h1);
  UNINTERLEAVE2(h0, g1, out[0], out[1]);
}